

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalGet::Deserialize(LogicalGet *this,Deserializer *deserializer)

{
  table_function_get_virtual_columns_t p_Var1;
  element_type *peVar2;
  table_function_bind_t p_Var3;
  pointer pCVar4;
  ulong __n;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var5;
  _Head_base<0UL,_duckdb::LogicalGet_*,_false> _Var6;
  optional_ptr<duckdb::FunctionData,_true> oVar7;
  pointer puVar8;
  undefined8 uVar9;
  bool bVar10;
  LogicalGet *this_00;
  pointer pLVar11;
  ClientContext *pCVar12;
  pointer pLVar13;
  pointer pLVar14;
  pointer pLVar15;
  pointer pLVar16;
  reference pvVar17;
  reference pvVar18;
  reference this_01;
  iterator iVar19;
  SerializationException *pSVar20;
  InternalException *this_02;
  TableFilterSet *ret;
  unsigned_long *col_id;
  unsigned_long *__args;
  pointer pCVar21;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var22;
  pointer __old_p;
  _Head_base<0UL,_duckdb::LogicalGet_*,_false> local_4a8;
  optional_ptr<duckdb::FunctionData,_true> local_4a0;
  allocator local_491;
  FunctionData *local_490;
  pointer local_488;
  idx_t idx;
  vector<duckdb::LogicalType,_true> bind_return_types;
  vector<unsigned_long,_true> legacy_column_ids;
  undefined1 local_438 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  bind_names;
  TableFunctionBindInput input;
  LogicalType local_3a0;
  LogicalType local_388;
  LogicalType local_370;
  LogicalType local_358;
  virtual_column_map_t virtual_columns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  TableFunctionRef empty_ref;
  pair<duckdb::TableFunction,_bool> entry;
  
  legacy_column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  legacy_column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  legacy_column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = (LogicalGet *)operator_new(0x3d8);
  LogicalGet(this_00);
  local_4a8._M_head_impl = this_00;
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  Deserializer::ReadProperty<unsigned_long>(deserializer,200,"table_index",&pLVar11->table_index);
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xc9,"returned_types",&pLVar11->returned_types);
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xca,"names",&pLVar11->names);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcb,"column_ids",&legacy_column_ids);
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcc,"projection_ids",&pLVar11->projection_ids);
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  ret = &pLVar11->table_filters;
  Deserializer::ReadProperty<duckdb::TableFilterSet>(deserializer,0xcd,"table_filters",ret);
  FunctionSerializer::DeserializeBase<duckdb::TableFunction,duckdb::TableFunctionCatalogEntry>
            (&entry,(FunctionSerializer *)deserializer,(Deserializer *)0x19,(CatalogType)ret);
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  TableFunction::operator=(&pLVar11->function,&entry.first);
  local_488 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
  if (entry.second == false) {
    local_4a0.ptr = (FunctionData *)0x0;
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    local_4a0.ptr = (FunctionData *)0x0;
    Deserializer::ReadProperty<duckdb::vector<duckdb::Value,true>>
              (deserializer,0xce,"parameters",&pLVar11->parameters);
    local_4a0.ptr = (FunctionData *)0x0;
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    local_4a0.ptr = (FunctionData *)0x0;
    Deserializer::
    ReadProperty<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              (deserializer,0xcf,"named_parameters",&pLVar11->named_parameters);
    local_4a0.ptr = (FunctionData *)0x0;
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    local_4a0.ptr = (FunctionData *)0x0;
    Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
              (deserializer,0xd0,"input_table_types",&pLVar11->input_table_types);
    local_4a0.ptr = (FunctionData *)0x0;
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    local_4a0.ptr = (FunctionData *)0x0;
    Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
              (deserializer,0xd1,"input_table_names",&pLVar11->input_table_names);
  }
  else {
    FunctionSerializer::FunctionDeserialize<duckdb::TableFunction>
              ((FunctionSerializer *)&empty_ref,deserializer,&local_488->function);
    local_4a0.ptr = (FunctionData *)empty_ref.super_TableRef._vptr_TableRef;
  }
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (deserializer,0xd2,"projected_input",&pLVar11->projected_input);
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::ColumnIndex,true>>
            (deserializer,0xd3,"column_indexes",&pLVar11->column_ids);
  if (legacy_column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      legacy_column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    puVar8 = legacy_column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __args = legacy_column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((pLVar11->column_ids).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pLVar11->column_ids).
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar20 = (SerializationException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&empty_ref,
                 "LogicalGet::Deserialize - either column_ids or column_indexes should be set - not both"
                 ,(allocator *)&input);
      SerializationException::SerializationException(pSVar20,(string *)&empty_ref);
      __cxa_throw(pSVar20,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
    }
    for (; __args != puVar8; __args = __args + 1) {
      pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                            *)&local_4a8);
      ::std::vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>>::
      emplace_back<unsigned_long&>
                ((vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>> *)
                 &pLVar11->column_ids,__args);
    }
  }
  pCVar12 = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  _Var22._M_head_impl = local_4a0.ptr;
  virtual_columns._M_h._M_buckets = &virtual_columns._M_h._M_single_bucket;
  virtual_columns._M_h._M_bucket_count = 1;
  virtual_columns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  virtual_columns._M_h._M_element_count = 0;
  virtual_columns._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  virtual_columns._M_h._M_rehash_policy._M_next_resize = 0;
  virtual_columns._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (entry.second == false) {
    local_438._56_8_ = this;
    TableFunctionRef::TableFunctionRef(&empty_ref);
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    pLVar13 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    pLVar14 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    pLVar15 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    peVar2 = (local_488->function).function_info.internal.
             super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pLVar16 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    oVar7.ptr = (FunctionData *)local_4a0;
    input.inputs = &pLVar11->parameters;
    input.named_parameters = &pLVar13->named_parameters;
    input.input_table_types = &pLVar14->input_table_types;
    input.input_table_names = &pLVar15->input_table_names;
    input.table_function = &pLVar16->function;
    input.binder.ptr = (Binder *)0x0;
    input.ref = &empty_ref;
    bind_return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bind_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bind_return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bind_return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bind_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bind_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var3 = (local_488->function).bind;
    input.info.ptr = peVar2;
    if (p_Var3 == (table_function_bind_t)0x0) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_438,"Table function \"%s\" has neither bind nor (de)serialize",
                 (allocator *)&idx);
      ::std::__cxx11::string::string
                ((string *)&local_288,
                 (string *)
                 &(local_488->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
                  super_Function.name);
      InternalException::InternalException<std::__cxx11::string>
                (this_02,(string *)local_438,&local_288);
      __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*p_Var3)((ClientContext *)local_438,(TableFunctionBindInput *)pCVar12,
              (vector<duckdb::LogicalType,_true> *)&input,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)&bind_return_types);
    uVar9 = local_438._0_8_;
    local_438._0_8_ = (element_type *)0x0;
    if ((oVar7.ptr != (FunctionData *)0x0) &&
       ((*(oVar7.ptr)->_vptr_FunctionData[1])(oVar7.ptr),
       (element_type *)local_438._0_8_ != (element_type *)0x0)) {
      (*(*(_func_int ***)local_438._0_8_)[1])();
    }
    p_Var1 = (local_488->function).get_virtual_columns;
    local_490 = (FunctionData *)uVar9;
    if (p_Var1 != (table_function_get_virtual_columns_t)0x0) {
      (*p_Var1)((virtual_column_map_t *)local_438,pCVar12,
                (optional_ptr<duckdb::FunctionData,_true>)uVar9);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::operator=(&virtual_columns._M_h,
                  (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_438);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_438);
    }
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    pCVar4 = (pLVar11->column_ids).
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
             super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar21 = (pLVar11->column_ids).
                   super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start; pCVar21 != pCVar4;
        pCVar21 = pCVar21 + 1) {
      __n = pCVar21->index;
      if (__n < 0x8000000000000000) {
        pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                              *)&local_4a8);
        pvVar17 = vector<duckdb::LogicalType,_true>::get<true>(&pLVar11->returned_types,__n);
        pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
                  operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                              *)&local_4a8);
        pvVar18 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&pLVar11->names,__n);
        this_01 = vector<duckdb::LogicalType,_true>::get<true>(&bind_return_types,__n);
        bVar10 = LogicalType::operator!=(this_01,pvVar17);
        if (bVar10) {
          pSVar20 = (SerializationException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_438,
                     "Table function deserialization failure in function \"%s\" - column with name %s was serialized with type %s, but now has type %s"
                     ,(allocator *)&idx);
          ::std::__cxx11::string::string
                    ((string *)&local_2e8,
                     (string *)
                     &(local_488->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
                      super_Function.name);
          ::std::__cxx11::string::string((string *)&local_308,(string *)pvVar18);
          LogicalType::LogicalType(&local_388,pvVar17);
          pvVar17 = vector<duckdb::LogicalType,_true>::get<true>(&bind_return_types,__n);
          LogicalType::LogicalType(&local_3a0,pvVar17);
          SerializationException::
          SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                    (pSVar20,(string *)local_438,&local_2e8,&local_308,&local_388,&local_3a0);
          __cxa_throw(pSVar20,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
      }
      else {
        idx = __n;
        iVar19 = ::std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&virtual_columns._M_h,&idx);
        if (iVar19.
            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
            _M_cur == (__node_type *)0x0) {
          pSVar20 = (SerializationException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_438,
                     "Table function deserialization failure - could not find virtual column with id %d"
                     ,&local_491);
          SerializationException::SerializationException<unsigned_long>
                    (pSVar20,(string *)local_438,idx);
          __cxa_throw(pSVar20,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        pvVar17 = vector<duckdb::LogicalType,_true>::get<true>(&bind_return_types,idx);
        bVar10 = LogicalType::operator!=
                           (pvVar17,(LogicalType *)
                                    ((long)iVar19.
                                           super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                                           ._M_cur + 0x30));
        if (bVar10) {
          pSVar20 = (SerializationException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_438,
                     "Table function deserialization failure in function \"%s\" - virtual column with name %s was serialized with type %s, but now has type %s"
                     ,&local_491);
          ::std::__cxx11::string::string
                    ((string *)&local_2a8,
                     (string *)
                     &(local_488->function).super_SimpleNamedParameterFunction.super_SimpleFunction.
                      super_Function.name);
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,
                     (string *)
                     ((long)iVar19.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                            ._M_cur + 0x10));
          LogicalType::LogicalType
                    (&local_358,
                     (LogicalType *)
                     ((long)iVar19.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                            ._M_cur + 0x30));
          pvVar17 = vector<duckdb::LogicalType,_true>::get<true>(&bind_return_types,idx);
          LogicalType::LogicalType(&local_370,pvVar17);
          SerializationException::
          SerializationException<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
                    (pSVar20,(string *)local_438,&local_2a8,&local_2c8,&local_358,&local_370);
          __cxa_throw(pSVar20,&SerializationException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
      }
    }
    pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
              operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                          *)&local_4a8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
              (&(pLVar11->returned_types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &bind_return_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&bind_names);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&bind_return_types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    TableFunctionRef::~TableFunctionRef(&empty_ref);
    this = (LogicalGet *)local_438._56_8_;
    _Var22._M_head_impl = local_490;
  }
  else {
    p_Var1 = (local_488->function).get_virtual_columns;
    if (p_Var1 != (table_function_get_virtual_columns_t)0x0) {
      (*p_Var1)((virtual_column_map_t *)&empty_ref,pCVar12,local_4a0);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::operator=(&virtual_columns._M_h,
                  (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&empty_ref);
      ::std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&empty_ref);
    }
  }
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::operator=(&(pLVar11->virtual_columns)._M_h,&virtual_columns._M_h);
  pLVar11 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>::
            operator->((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                        *)&local_4a8);
  _Var5._M_head_impl =
       (pLVar11->bind_data).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (pLVar11->bind_data).
  super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var22._M_head_impl;
  if (_Var5._M_head_impl != (FunctionData *)0x0) {
    (*(_Var5._M_head_impl)->_vptr_FunctionData[1])();
  }
  _Var6._M_head_impl = local_4a8._M_head_impl;
  local_4a8._M_head_impl = (LogicalGet *)0x0;
  *(LogicalGet **)this = _Var6._M_head_impl;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&virtual_columns._M_h);
  TableFunction::~TableFunction(&entry.first);
  if (local_4a8._M_head_impl != (LogicalGet *)0x0) {
    (*((local_4a8._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&legacy_column_ids);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalGet::Deserialize(Deserializer &deserializer) {
	vector<column_t> legacy_column_ids;

	auto result = unique_ptr<LogicalGet>(new LogicalGet());
	deserializer.ReadProperty(200, "table_index", result->table_index);
	deserializer.ReadProperty(201, "returned_types", result->returned_types);
	deserializer.ReadProperty(202, "names", result->names);
	deserializer.ReadPropertyWithDefault(203, "column_ids", legacy_column_ids);
	deserializer.ReadProperty(204, "projection_ids", result->projection_ids);
	deserializer.ReadProperty(205, "table_filters", result->table_filters);
	auto entry = FunctionSerializer::DeserializeBase<TableFunction, TableFunctionCatalogEntry>(
	    deserializer, CatalogType::TABLE_FUNCTION_ENTRY);
	result->function = entry.first;
	auto &function = result->function;
	auto has_serialize = entry.second;
	unique_ptr<FunctionData> bind_data;
	if (!has_serialize) {
		deserializer.ReadProperty(206, "parameters", result->parameters);
		deserializer.ReadProperty(207, "named_parameters", result->named_parameters);
		deserializer.ReadProperty(208, "input_table_types", result->input_table_types);
		deserializer.ReadProperty(209, "input_table_names", result->input_table_names);
	} else {
		bind_data = FunctionSerializer::FunctionDeserialize(deserializer, function);
	}
	deserializer.ReadProperty(210, "projected_input", result->projected_input);
	deserializer.ReadPropertyWithDefault(211, "column_indexes", result->column_ids);
	if (!legacy_column_ids.empty()) {
		if (!result->column_ids.empty()) {
			throw SerializationException(
			    "LogicalGet::Deserialize - either column_ids or column_indexes should be set - not both");
		}
		for (auto &col_id : legacy_column_ids) {
			result->column_ids.emplace_back(col_id);
		}
	}
	auto &context = deserializer.Get<ClientContext &>();
	virtual_column_map_t virtual_columns;
	if (!has_serialize) {
		TableFunctionRef empty_ref;
		TableFunctionBindInput input(result->parameters, result->named_parameters, result->input_table_types,
		                             result->input_table_names, function.function_info.get(), nullptr, result->function,
		                             empty_ref);

		vector<LogicalType> bind_return_types;
		vector<string> bind_names;
		if (!function.bind) {
			throw InternalException("Table function \"%s\" has neither bind nor (de)serialize", function.name);
		}
		bind_data = function.bind(context, input, bind_return_types, bind_names);
		if (function.get_virtual_columns) {
			virtual_columns = function.get_virtual_columns(context, bind_data.get());
		}

		for (auto &col_id : result->column_ids) {
			if (col_id.IsVirtualColumn()) {
				auto idx = col_id.GetPrimaryIndex();
				auto ventry = virtual_columns.find(idx);
				if (ventry == virtual_columns.end()) {
					throw SerializationException(
					    "Table function deserialization failure - could not find virtual column with id %d", idx);
				}
				auto &ret_type = ventry->second.type;
				auto &col_name = ventry->second.name;
				if (bind_return_types[idx] != ret_type) {
					throw SerializationException(
					    "Table function deserialization failure in function \"%s\" - virtual column with "
					    "name %s was serialized with type %s, but now has type %s",
					    function.name, col_name, ret_type, bind_return_types[idx]);
				}
			} else {
				auto idx = col_id.GetPrimaryIndex();
				auto &ret_type = result->returned_types[idx];
				auto &col_name = result->names[idx];
				if (bind_return_types[idx] != ret_type) {
					throw SerializationException(
					    "Table function deserialization failure in function \"%s\" - column with "
					    "name %s was serialized with type %s, but now has type %s",
					    function.name, col_name, ret_type, bind_return_types[idx]);
				}
			}
		}
		result->returned_types = std::move(bind_return_types);
	} else if (function.get_virtual_columns) {
		virtual_columns = function.get_virtual_columns(context, bind_data.get());
	}
	result->virtual_columns = std::move(virtual_columns);
	result->bind_data = std::move(bind_data);
	return std::move(result);
}